

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

void __thiscall QPDF::JSONReactor::containerStart(JSONReactor *this)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((this->next_obj).super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>::
    emplace_back<QPDF::JSONReactor::state_e&,QPDFObjectHandle>
              ((vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>
                *)&this->stack,&this->next_state,&this->next_obj);
    local_18._M_ptr = (element_type *)0x0;
    local_18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&this->next_obj,&local_18);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
    return;
  }
  std::vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>>::
  emplace_back<QPDF::JSONReactor::state_e&>
            ((vector<QPDF::JSONReactor::StackFrame,std::allocator<QPDF::JSONReactor::StackFrame>> *)
             &this->stack,&this->next_state);
  return;
}

Assistant:

void
QPDF::JSONReactor::containerStart()
{
    if (next_obj) {
        stack.emplace_back(next_state, std::move(next_obj));
        next_obj = QPDFObjectHandle();
    } else {
        stack.emplace_back(next_state);
    }
}